

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugins.c
# Opt level: O3

void * lys_ext_complex_get_substmt(LY_STMT stmt,lys_ext_instance_complex *ext,lyext_substmt **info)

{
  lyext_substmt *plVar1;
  lyext_plugin *plVar2;
  long lVar3;
  lyext_substmt *plVar4;
  LY_STMT LVar5;
  
  if ((((ext == (lys_ext_instance_complex *)0x0) || (ext->def == (lys_ext *)0x0)) ||
      (plVar2 = ext->def->plugin, plVar2 == (lyext_plugin *)0x0)) || (plVar2->type != LYEXT_COMPLEX)
     ) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).",
           "lys_ext_complex_get_substmt");
  }
  else {
    plVar4 = ext->substmt;
    if (plVar4 == (lyext_substmt *)0x0) {
      if (info != (lyext_substmt **)0x0) {
        *info = (lyext_substmt *)0x0;
      }
    }
    else {
      lVar3 = 0;
      LVar5 = plVar4->stmt;
      while (LVar5 != LY_STMT_UNKNOWN) {
        if (stmt == LY_STMT_NODE) {
          if ((uint)(LVar5 + ~LY_STMT_MODULE) < 0xe) goto LAB_00170600;
        }
        else if (LVar5 == stmt) {
LAB_00170600:
          if (info != (lyext_substmt **)0x0) {
            *info = plVar4;
          }
          break;
        }
        lVar3 = lVar3 + 1;
        plVar1 = plVar4 + 1;
        plVar4 = plVar4 + 1;
        LVar5 = plVar1->stmt;
      }
      if (ext->substmt[lVar3].stmt != LY_STMT_UNKNOWN) {
        return ext->content + ext->substmt[lVar3].offset;
      }
    }
  }
  return (void *)0x0;
}

Assistant:

API void *
lys_ext_complex_get_substmt(LY_STMT stmt, struct lys_ext_instance_complex *ext, struct lyext_substmt **info)
{
    int i;

    if (!ext || !ext->def || !ext->def->plugin || ext->def->plugin->type != LYEXT_COMPLEX) {
        LOGARG;
        return NULL;
    }

    if (!ext->substmt) {
        /* no substatement defined in the plugin */
        if (info) {
            *info = NULL;
        }
        return NULL;
    }

    /* search the substatements defined by the plugin */
    for (i = 0; ext->substmt[i].stmt; i++) {
        if (stmt == LY_STMT_NODE) {
            if (ext->substmt[i].stmt >= LY_STMT_ACTION && ext->substmt[i].stmt <= LY_STMT_USES) {
                if (info) {
                    *info = &ext->substmt[i];
                }
                break;
            }
        } else if (ext->substmt[i].stmt == stmt) {
            if (info) {
                *info = &ext->substmt[i];
            }
            break;
        }
    }

    if (ext->substmt[i].stmt) {
        return &ext->content[ext->substmt[i].offset];
    } else {
        return NULL;
    }
}